

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O1

void __thiscall DBot::ThinkForMove(DBot *this,ticcmd_t *cmd)

{
  ActorFlags *pAVar1;
  double *pdVar2;
  byte bVar3;
  APlayerPawn *pAVar4;
  AWeapon *pAVar5;
  player_t *ppVar6;
  double dVar7;
  double dVar8;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  PClass *pPVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PClass *pPVar14;
  AActor *pAVar15;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar16;
  AActor *pAVar17;
  short sVar18;
  short sVar19;
  DObject *pDVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  TThinkerIterator<AInventory> it;
  double local_68;
  undefined1 local_60 [32];
  DAngle local_40;
  DAngle local_38;
  
  pAVar15 = (this->dest).field_0.p;
  if (pAVar15 == (AActor *)0x0) {
    uVar21 = 0;
    uVar22 = 0;
LAB_004712e0:
    local_68 = (double)CONCAT44(uVar22,uVar21);
  }
  else {
    if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar15 = (this->dest).field_0.p;
      pAVar4 = this->player->mo;
      if ((pAVar15 != (AActor *)0x0) &&
         (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->dest).field_0.p = (AActor *)0x0;
        pAVar15 = (AActor *)0x0;
      }
      dVar7 = AActor::Distance2D(&pAVar4->super_AActor,pAVar15,false);
      uVar21 = SUB84(dVar7,0);
      uVar22 = (undefined4)((ulong)dVar7 >> 0x20);
      goto LAB_004712e0;
    }
    local_68 = 0.0;
    (this->dest).field_0.p = (AActor *)0x0;
  }
  pAVar15 = (this->missile).field_0.p;
  if (pAVar15 != (AActor *)0x0) {
    if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      dVar7 = (((this->missile).field_0.p)->Vel).X;
      if (((dVar7 != 0.0) || (NAN(dVar7))) &&
         ((dVar7 = (((this->missile).field_0.p)->Vel).Y, dVar7 != 0.0 || (NAN(dVar7))))) {
        pAVar15 = (this->missile).field_0.p;
        if ((pAVar15 != (AActor *)0x0) &&
           (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->missile).field_0.p = (AActor *)0x0;
          pAVar15 = (AActor *)0x0;
        }
        local_38.Degrees = 90.0;
        bVar10 = Check_LOS(this,pAVar15,&local_38);
        if (bVar10) goto LAB_00471379;
      }
      this->sleft = (bool)(this->sleft ^ 1);
    }
    (this->missile).field_0.p = (AActor *)0x0;
  }
LAB_00471379:
  pAVar15 = (this->missile).field_0.p;
  if (pAVar15 != (AActor *)0x0) {
    if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->missile).field_0.p = (AActor *)0x0;
      goto LAB_00471506;
    }
    pAVar15 = (this->missile).field_0.p;
    pAVar4 = this->player->mo;
    if ((pAVar15 != (AActor *)0x0) &&
       (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->missile).field_0.p = (AActor *)0x0;
      pAVar15 = (AActor *)0x0;
    }
    dVar7 = AActor::Distance2D(&pAVar4->super_AActor,pAVar15,false);
    if (686.6455078125 <= dVar7) goto LAB_00471506;
    pAVar15 = (this->missile).field_0.p;
    if ((pAVar15 != (AActor *)0x0) &&
       (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->missile).field_0.p = (AActor *)0x0;
      pAVar15 = (AActor *)0x0;
    }
    Pitch(this,pAVar15);
    pAVar15 = (this->missile).field_0.p;
    pAVar4 = this->player->mo;
    if ((pAVar15 != (AActor *)0x0) &&
       (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->missile).field_0.p = (AActor *)0x0;
      pAVar15 = (AActor *)0x0;
    }
    AActor::AngleTo((AActor *)local_60,&pAVar4->super_AActor,SUB81(pAVar15,0));
    (this->Angle).Degrees = (double)CONCAT44(local_60._4_4_,local_60._0_4_);
    bVar10 = this->sleft;
    sVar18 = 0x2800;
    if (bVar10 != false) {
      sVar18 = -0x2800;
    }
    (cmd->ucmd).sidemove = sVar18;
    (cmd->ucmd).forwardmove = -0x3200;
    pAVar4 = this->player->mo;
    dVar7 = (pAVar4->super_AActor).__Pos.Z;
    dVar8 = (pAVar4->super_AActor).__Pos.X - (this->old).X;
    dVar23 = (pAVar4->super_AActor).__Pos.Y - (this->old).Y;
    if ((dVar7 * dVar7 + dVar23 * dVar23 + dVar8 * dVar8 < 0.5820766091346741) &&
       (this->t_strafe < 1)) {
      this->t_strafe = 5;
      this->sleft = (bool)(bVar10 ^ 1);
    }
    pAVar15 = (this->enemy).field_0.p;
    if (pAVar15 == (AActor *)0x0) goto LAB_00471fc9;
    if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->enemy).field_0.p = (AActor *)0x0;
      goto LAB_00471fc9;
    }
    pAVar15 = (this->enemy).field_0.p;
    if ((pAVar15 != (AActor *)0x0) &&
       (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->enemy).field_0.p = (AActor *)0x0;
      pAVar15 = (AActor *)0x0;
    }
    local_40.Degrees = 60.0;
    bVar10 = Check_LOS(this,pAVar15,&local_40);
    if (!bVar10) goto LAB_00471fc9;
LAB_00471f6f:
    Dofire(this,cmd);
    goto LAB_00471fc9;
  }
LAB_00471506:
  pAVar15 = (this->enemy).field_0.p;
  if (pAVar15 == (AActor *)0x0) {
LAB_004718f2:
    pAVar15 = (this->mate).field_0.p;
    if (pAVar15 != (AActor *)0x0) {
      if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar15 = (this->enemy).field_0.p;
        if (pAVar15 != (AActor *)0x0) {
          if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00471973;
          (this->enemy).field_0.p = (AActor *)0x0;
        }
        pAVar15 = (this->dest).field_0.p;
        if (pAVar15 != (AActor *)0x0) {
          if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            pAVar15 = (this->mate).field_0.p;
            if ((pAVar15 != (AActor *)0x0) &&
               (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (this->mate).field_0.p = (AActor *)0x0;
              pAVar15 = (AActor *)0x0;
            }
            pAVar17 = (this->dest).field_0.p;
            if ((pAVar17 != (AActor *)0x0) &&
               (((pAVar17->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (this->dest).field_0.p = (AActor *)0x0;
              pAVar17 = (AActor *)0x0;
            }
            if (pAVar17 != pAVar15) goto LAB_00471973;
          }
          else {
            (this->dest).field_0.p = (AActor *)0x0;
          }
        }
        pAVar15 = (this->mate).field_0.p;
        if ((pAVar15 != (AActor *)0x0) &&
           (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->mate).field_0.p = (AActor *)0x0;
          pAVar15 = (AActor *)0x0;
        }
        Pitch(this,pAVar15);
        pAVar15 = (this->mate).field_0.p;
        if ((pAVar15 != (AActor *)0x0) &&
           (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->mate).field_0.p = (AActor *)0x0;
          pAVar15 = (AActor *)0x0;
        }
        bVar10 = Reachable(this,pAVar15);
        if (bVar10) {
          pAVar15 = (this->mate).field_0.p;
          pAVar4 = this->player->mo;
          if ((pAVar15 != (AActor *)0x0) &&
             (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->mate).field_0.p = (AActor *)0x0;
            pAVar15 = (AActor *)0x0;
          }
          AActor::AngleTo((AActor *)local_60,&pAVar4->super_AActor,SUB81(pAVar15,0));
          (this->Angle).Degrees = (double)CONCAT44(local_60._4_4_,local_60._0_4_);
          pAVar15 = (this->mate).field_0.p;
          pAVar4 = this->player->mo;
          if ((pAVar15 != (AActor *)0x0) &&
             (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->mate).field_0.p = (AActor *)0x0;
            pAVar15 = (AActor *)0x0;
          }
          dVar7 = AActor::Distance2D(&pAVar4->super_AActor,pAVar15,false);
          if (dVar7 <= 457.763671875) {
            if (dVar7 <= 228.8818359375) {
              if (dVar7 < 152.587890625) {
                (cmd->ucmd).forwardmove = -0x1900;
              }
            }
            else {
              (cmd->ucmd).forwardmove = 0x1900;
            }
          }
          else {
            (cmd->ucmd).forwardmove = 0x3200;
          }
        }
        else {
          pAVar15 = (this->dest).field_0.p;
          if ((pAVar15 != (AActor *)0x0) &&
             (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->dest).field_0.p = (AActor *)0x0;
            pAVar15 = (AActor *)0x0;
          }
          pAVar17 = (this->mate).field_0.p;
          if ((pAVar17 != (AActor *)0x0) &&
             (((pAVar17->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->mate).field_0.p = (AActor *)0x0;
            pAVar17 = (AActor *)0x0;
          }
          if ((pAVar17 == pAVar15) &&
             (uVar12 = FRandom::GenRand32(&pr_botmove), (uVar12 & 0xe0) == 0)) {
            (this->dest).field_0.p = (AActor *)0x0;
          }
        }
        if (bVar10) goto LAB_00471fc9;
        goto LAB_0047197a;
      }
      (this->mate).field_0.p = (AActor *)0x0;
    }
LAB_00471973:
    this->first_shot = true;
  }
  else {
    if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->enemy).field_0.p = (AActor *)0x0;
      goto LAB_004718f2;
    }
    pAVar15 = (this->enemy).field_0.p;
    pAVar4 = this->player->mo;
    if ((pAVar15 != (AActor *)0x0) &&
       (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->enemy).field_0.p = (AActor *)0x0;
      pAVar15 = (AActor *)0x0;
    }
    bVar10 = P_CheckSight(&pAVar4->super_AActor,pAVar15,0);
    if (!bVar10) goto LAB_004718f2;
    pAVar15 = (this->enemy).field_0.p;
    if ((pAVar15 != (AActor *)0x0) &&
       (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->enemy).field_0.p = (AActor *)0x0;
      pAVar15 = (AActor *)0x0;
    }
    Pitch(this,pAVar15);
    pAVar15 = (this->dest).field_0.p;
    if (pAVar15 == (AActor *)0x0) {
LAB_00471dd1:
      (this->dest).field_0.p = (AActor *)0x0;
      ppVar6 = this->player;
      if ((ppVar6->ReadyWeapon != (AWeapon *)0x0) &&
         (((ppVar6->ReadyWeapon->super_AInventory).field_0x4dd & 2) == 0)) {
        pAVar1 = &(ppVar6->mo->super_AActor).flags;
        pAVar1->Value = pAVar1->Value & 0xfffffbff;
      }
      if (((((this->enemy).field_0.p)->flags3).Value & 0x2000) == 0) {
        this->t_fight = 0x46;
      }
      if ((0 < this->t_strafe) ||
         ((pAVar4 = ppVar6->mo, dVar7 = (pAVar4->super_AActor).__Pos.Z,
          dVar8 = (pAVar4->super_AActor).__Pos.X - (this->old).X,
          dVar23 = (pAVar4->super_AActor).__Pos.Y - (this->old).Y,
          0.5820766091346741 <= dVar7 * dVar7 + dVar23 * dVar23 + dVar8 * dVar8 &&
          (uVar12 = FRandom::GenRand32(&pr_botmove),
          uVar12 = (uVar12 & 0xff) * -0x11111111 + 0xaaaaaaaa,
          0x8888888 < (uVar12 >> 1 | (uint)((uVar12 & 1) != 0) << 0x1f))))) {
        bVar10 = false;
      }
      else {
        this->t_strafe = 5;
        this->sleft = (bool)(this->sleft ^ 1);
        bVar10 = true;
      }
      pAVar15 = (this->enemy).field_0.p;
      pAVar4 = this->player->mo;
      if ((pAVar15 != (AActor *)0x0) &&
         (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->enemy).field_0.p = (AActor *)0x0;
        pAVar15 = (AActor *)0x0;
      }
      AActor::AngleTo((AActor *)local_60,&pAVar4->super_AActor,SUB81(pAVar15,0));
      (this->Angle).Degrees = (double)CONCAT44(local_60._4_4_,local_60._0_4_);
      if (this->player->ReadyWeapon == (AWeapon *)0x0) {
LAB_00471f1d:
        bVar3 = *(byte *)((long)&(((this->enemy).field_0.p)->flags3).Value + 1);
        sVar19 = 0x3200;
        sVar18 = 0x1900;
LAB_00471f32:
        if ((bVar3 & 0x20) == 0) {
          sVar18 = sVar19;
        }
        (cmd->ucmd).forwardmove = sVar18;
      }
      else {
        pAVar4 = this->player->mo;
        pAVar15 = (this->enemy).field_0.p;
        if ((pAVar15 != (AActor *)0x0) &&
           (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->enemy).field_0.p = (AActor *)0x0;
          pAVar15 = (AActor *)0x0;
        }
        dVar7 = AActor::Distance2D(&pAVar4->super_AActor,pAVar15,false);
        pdVar2 = &this->player->ReadyWeapon->MoveCombatDist;
        if (*pdVar2 <= dVar7 && dVar7 != *pdVar2) goto LAB_00471f1d;
        if (!bVar10) {
          bVar3 = *(byte *)((long)&(((this->enemy).field_0.p)->flags3).Value + 1);
          sVar19 = -0x3200;
          sVar18 = -0x1900;
          goto LAB_00471f32;
        }
      }
      bVar10 = this->sleft != false;
      sVar18 = 0x2800;
      if (bVar10) {
        sVar18 = -0x2800;
      }
      sVar19 = 0x1800;
      if (bVar10) {
        sVar19 = -0x1800;
      }
      if (((((this->enemy).field_0.p)->flags3).Value >> 0xd & 1) == 0) {
        sVar19 = sVar18;
      }
      (cmd->ucmd).sidemove = sVar19;
      goto LAB_00471f6f;
    }
    if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->dest).field_0.p = (AActor *)0x0;
      goto LAB_00471dd1;
    }
    if (((((this->dest).field_0.p)->flags).Value & 1) == 0) goto LAB_00471dd1;
    if ((this->player->mo->super_AActor).health < (this->skill).isp) {
      pDVar20 = (this->dest).field_0.o;
      if ((pDVar20 != (DObject *)0x0) && ((pDVar20->ObjectFlags & 0x20) != 0)) {
        (this->dest).field_0.p = (AActor *)0x0;
        pDVar20 = (DObject *)0x0;
      }
      local_60._0_4_ = FName::NameManager::FindName(&FName::NameData,"Medikit",true);
      pPVar13 = PClass::FindClass((FName *)local_60);
      if (pDVar20->Class == (PClass *)0x0) {
        iVar11 = (**pDVar20->_vptr_DObject)(pDVar20);
        pDVar20->Class = (PClass *)CONCAT44(extraout_var,iVar11);
      }
      pPVar14 = pDVar20->Class;
      bVar10 = pPVar14 != (PClass *)0x0;
      if (pPVar14 != pPVar13 && bVar10) {
        do {
          pPVar14 = pPVar14->ParentClass;
          bVar10 = pPVar14 != (PClass *)0x0;
          if (pPVar14 == pPVar13) break;
        } while (pPVar14 != (PClass *)0x0);
      }
      if (!bVar10) {
        pDVar20 = (this->dest).field_0.o;
        if ((pDVar20 != (DObject *)0x0) && ((pDVar20->ObjectFlags & 0x20) != 0)) {
          (this->dest).field_0.p = (AActor *)0x0;
          pDVar20 = (DObject *)0x0;
        }
        local_60._0_4_ = FName::NameManager::FindName(&FName::NameData,"Stimpack",true);
        pPVar13 = PClass::FindClass((FName *)local_60);
        if (pDVar20->Class == (PClass *)0x0) {
          iVar11 = (**pDVar20->_vptr_DObject)(pDVar20);
          pDVar20->Class = (PClass *)CONCAT44(extraout_var_00,iVar11);
        }
        pPVar14 = pDVar20->Class;
        bVar10 = pPVar14 != (PClass *)0x0;
        if (pPVar14 != pPVar13 && bVar10) {
          do {
            pPVar14 = pPVar14->ParentClass;
            bVar10 = pPVar14 != (PClass *)0x0;
            if (pPVar14 == pPVar13) break;
          } while (pPVar14 != (PClass *)0x0);
        }
        if (!bVar10) {
          pDVar20 = (this->dest).field_0.o;
          if ((pDVar20 != (DObject *)0x0) && ((pDVar20->ObjectFlags & 0x20) != 0)) {
            (this->dest).field_0.p = (AActor *)0x0;
            pDVar20 = (DObject *)0x0;
          }
          pPVar13 = PClass::FindClass("Soulsphere");
          bVar10 = DObject::IsKindOf(pDVar20,pPVar13);
          if (!bVar10) {
            pDVar20 = (this->dest).field_0.o;
            if ((pDVar20 != (DObject *)0x0) && ((pDVar20->ObjectFlags & 0x20) != 0)) {
              (this->dest).field_0.p = (AActor *)0x0;
              pDVar20 = (DObject *)0x0;
            }
            pPVar13 = PClass::FindClass("Megasphere");
            bVar10 = DObject::IsKindOf(pDVar20,pPVar13);
            if (!bVar10) {
              pDVar20 = (this->dest).field_0.o;
              if ((pDVar20 != (DObject *)0x0) && ((pDVar20->ObjectFlags & 0x20) != 0)) {
                (this->dest).field_0.p = (AActor *)0x0;
                pDVar20 = (DObject *)0x0;
              }
              pPVar13 = PClass::FindClass("CrystalVial");
              bVar10 = DObject::IsKindOf(pDVar20,pPVar13);
              if (!bVar10) goto LAB_00471776;
            }
          }
        }
      }
    }
    else {
LAB_00471776:
      pDVar20 = (this->dest).field_0.o;
      if ((pDVar20 != (DObject *)0x0) && ((pDVar20->ObjectFlags & 0x20) != 0)) {
        (this->dest).field_0.p = (AActor *)0x0;
        pDVar20 = (DObject *)0x0;
      }
      local_60._0_4_ = FName::NameManager::FindName(&FName::NameData,"Invulnerability",true);
      pPVar13 = PClass::FindClass((FName *)local_60);
      if (pDVar20->Class == (PClass *)0x0) {
        iVar11 = (**pDVar20->_vptr_DObject)(pDVar20);
        pDVar20->Class = (PClass *)CONCAT44(extraout_var_01,iVar11);
      }
      pPVar14 = pDVar20->Class;
      bVar10 = pPVar14 != (PClass *)0x0;
      if (pPVar14 != pPVar13 && bVar10) {
        do {
          pPVar14 = pPVar14->ParentClass;
          bVar10 = pPVar14 != (PClass *)0x0;
          if (pPVar14 == pPVar13) break;
        } while (pPVar14 != (PClass *)0x0);
      }
      if (!bVar10) {
        pDVar20 = (this->dest).field_0.o;
        if ((pDVar20 != (DObject *)0x0) && ((pDVar20->ObjectFlags & 0x20) != 0)) {
          (this->dest).field_0.p = (AActor *)0x0;
          pDVar20 = (DObject *)0x0;
        }
        local_60._0_4_ = FName::NameManager::FindName(&FName::NameData,"Invisibility",true);
        pPVar13 = PClass::FindClass((FName *)local_60);
        if (pDVar20->Class == (PClass *)0x0) {
          iVar11 = (**pDVar20->_vptr_DObject)(pDVar20);
          pDVar20->Class = (PClass *)CONCAT44(extraout_var_02,iVar11);
        }
        pPVar14 = pDVar20->Class;
        bVar10 = pPVar14 != (PClass *)0x0;
        if (pPVar14 != pPVar13 && bVar10) {
          do {
            pPVar14 = pPVar14->ParentClass;
            bVar10 = pPVar14 != (PClass *)0x0;
            if (pPVar14 == pPVar13) break;
          } while (pPVar14 != (PClass *)0x0);
        }
        if (!bVar10) {
          pDVar20 = (this->dest).field_0.o;
          if ((pDVar20 != (DObject *)0x0) && ((pDVar20->ObjectFlags & 0x20) != 0)) {
            (this->dest).field_0.p = (AActor *)0x0;
            pDVar20 = (DObject *)0x0;
          }
          pPVar13 = PClass::FindClass("Megasphere");
          bVar10 = DObject::IsKindOf(pDVar20,pPVar13);
          if ((((133.514404296875 <= local_68) && (!bVar10)) &&
              (pAVar5 = this->player->ReadyWeapon, pAVar5 != (AWeapon *)0x0)) &&
             (((pAVar5->super_AInventory).field_0x4dd & 2) == 0)) goto LAB_00471dd1;
        }
      }
    }
    if (((534.0576171875 <= local_68) &&
        (pAVar5 = this->player->ReadyWeapon, pAVar5 != (AWeapon *)0x0)) &&
       (((pAVar5->super_AInventory).field_0x4dd & 2) == 0)) goto LAB_00471dd1;
    pAVar15 = (this->dest).field_0.p;
    if ((pAVar15 != (AActor *)0x0) &&
       (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->dest).field_0.p = (AActor *)0x0;
      pAVar15 = (AActor *)0x0;
    }
    bVar10 = Reachable(this,pAVar15);
    if (!bVar10) goto LAB_00471dd1;
  }
LAB_0047197a:
  pAVar15 = (this->enemy).field_0.p;
  if (pAVar15 != (AActor *)0x0) {
    if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar15 = (this->enemy).field_0.p;
      if ((pAVar15 != (AActor *)0x0) &&
         (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->enemy).field_0.p = (AActor *)0x0;
        pAVar15 = (AActor *)0x0;
      }
      local_60._24_8_ = (DObject *)0x4056800000000000;
      bVar10 = Check_LOS(this,pAVar15,(DAngle *)(local_60 + 0x18));
      if (bVar10) {
        Dofire(this,cmd);
      }
    }
    else {
      (this->enemy).field_0.p = (AActor *)0x0;
    }
  }
  pAVar15 = (this->dest).field_0.p;
  if ((pAVar15 != (AActor *)0x0) &&
     ((((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 ||
      ((((((this->dest).field_0.p)->flags).Value & 1) == 0 && (((this->dest).field_0.p)->health < 0)
       ))))) {
    (this->dest).field_0.p = (AActor *)0x0;
  }
  pAVar15 = (this->dest).field_0.p;
  if (pAVar15 == (AActor *)0x0) {
LAB_00471a21:
    if ((this->t_fight == 0) || (pAVar15 = (this->enemy).field_0.p, pAVar15 == (AActor *)0x0)) {
LAB_00471ae0:
      uVar12 = FRandom::GenRand32(&pr_botmove);
      if ((uVar12 & 0xff) < 0x80) {
        if ((bglobal.firstthing.field_0 != (AActor *)0x0) &&
           ((*(byte *)((long)bglobal.firstthing.field_0 + 0x20) & 0x20) != 0)) {
          bglobal.firstthing.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
        }
        FThinkerIterator::FThinkerIterator
                  ((FThinkerIterator *)local_60,AInventory::RegistrationInfo.MyClass,0x80,
                   (DThinker *)bglobal.firstthing.field_0);
        aVar16.p = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_60);
        if ((aVar16.p != (AActor *)0x0) ||
           (aVar16.p = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_60),
           aVar16.p != (AActor *)0x0)) {
          uVar12 = uVar12 & 0x3f;
          if (uVar12 != 0) {
            do {
              aVar16.p = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_60);
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          aVar9 = aVar16;
          if (aVar16.p == (AActor *)0x0) {
            aVar16.p = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_60);
            aVar9.p = aVar16.p;
          }
          goto LAB_00471c01;
        }
      }
      else {
        pAVar15 = (this->mate).field_0.p;
        if (pAVar15 != (AActor *)0x0) {
          if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            if (0xb2 < (uVar12 & 0xff)) {
              pAVar15 = (this->mate).field_0.p;
              pAVar4 = this->player->mo;
              if ((pAVar15 != (AActor *)0x0) &&
                 (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (this->mate).field_0.p = (AActor *)0x0;
                pAVar15 = (AActor *)0x0;
              }
              bVar10 = P_CheckSight(&pAVar4->super_AActor,pAVar15,0);
              if (!bVar10) goto LAB_00471bd4;
            }
            aVar16 = (this->mate).field_0;
            aVar9 = bglobal.firstthing.field_0;
            goto LAB_00471c01;
          }
          (this->mate).field_0.p = (AActor *)0x0;
        }
LAB_00471bd4:
        if ((playeringame[uVar12 & 7] == true) &&
           (aVar16 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                     ((anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)
                     (&players + (ulong)(uVar12 & 7) * 0x54))->p, aVar9 = bglobal.firstthing.field_0
           , 0 < (aVar16.p)->health)) goto LAB_00471c01;
      }
    }
    else {
      if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (this->enemy).field_0.p = (AActor *)0x0;
        goto LAB_00471ae0;
      }
      if ((((this->enemy).field_0.p)->player != (player_t *)0x0) &&
         ((((((this->enemy).field_0.p)->player->ReadyWeapon == (AWeapon *)0x0 ||
            (((((this->enemy).field_0.p)->player->ReadyWeapon->super_AInventory).field_0x4df & 0x40)
             == 0)) &&
           (uVar12 = FRandom::GenRand32(&pr_botmove),
           (int)((uVar12 & 0xff) % 100) <= (this->skill).isp)) ||
          ((pAVar5 = this->player->ReadyWeapon, pAVar5 == (AWeapon *)0x0 ||
           (((pAVar5->super_AInventory).field_0x4dd & 2) != 0)))))) {
        pAVar15 = (this->enemy).field_0.p;
        pAVar4 = this->player->mo;
        if ((pAVar15 != (AActor *)0x0) &&
           (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->enemy).field_0.p = (AActor *)0x0;
          pAVar15 = (AActor *)0x0;
        }
        AActor::AngleTo((AActor *)local_60,&pAVar4->super_AActor,SUB81(pAVar15,0));
        (this->Angle).Degrees = (double)CONCAT44(local_60._4_4_,local_60._0_4_);
        goto LAB_00471c05;
      }
      aVar16 = (this->enemy).field_0;
      aVar9 = bglobal.firstthing.field_0;
LAB_00471c01:
      bglobal.firstthing.field_0 = aVar9;
      (this->dest).field_0 = aVar16;
    }
LAB_00471c05:
    pAVar15 = (this->dest).field_0.p;
    if (pAVar15 != (AActor *)0x0) {
      if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        this->t_roam = 0x8c;
      }
      else {
        (this->dest).field_0.p = (AActor *)0x0;
      }
    }
  }
  else if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->dest).field_0.p = (AActor *)0x0;
    goto LAB_00471a21;
  }
  pAVar15 = (this->dest).field_0.p;
  if (pAVar15 != (AActor *)0x0) {
    if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      Roam(this,cmd);
    }
    else {
      (this->dest).field_0.p = (AActor *)0x0;
    }
  }
LAB_00471fc9:
  if ((this->t_roam == 0) && (pAVar15 = (this->dest).field_0.p, pAVar15 != (AActor *)0x0)) {
    if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      (this->prev).field_0 = (this->dest).field_0;
    }
    (this->dest).field_0.p = (AActor *)0x0;
  }
  if (this->t_fight < 0x23) {
    pAVar1 = &(this->player->mo->super_AActor).flags;
    pAVar1->Value = pAVar1->Value | 0x400;
  }
  pAVar4 = this->player->mo;
  dVar7 = (pAVar4->super_AActor).__Pos.Y;
  (this->old).X = (pAVar4->super_AActor).__Pos.X;
  (this->old).Y = dVar7;
  return;
}

Assistant:

void DBot::ThinkForMove (ticcmd_t *cmd)
{
	double dist;
	bool stuck;
	int r;

	stuck = false;
	dist = dest ? player->mo->Distance2D(dest) : 0;

	if (missile &&
		(!missile->Vel.X || !missile->Vel.Y || !Check_LOS(missile, SHOOTFOV*3/2)))
	{
		sleft = !sleft;
		missile = NULL; //Probably ended its travel.
	}

#if 0	// this has always been broken and without any reference it cannot be fixed.
	if (player->mo->Angles.Pitch > 0)
		player->mo->Angles.Pitch -= 80;
	else if (player->mo->Angles.Pitch <= -60)
		player->mo->Angles.Pitch += 80;
#endif

	//HOW TO MOVE:
	if (missile && (player->mo->Distance2D(missile)<AVOID_DIST)) //try avoid missile got from P_Mobj.c thinking part.
	{
		Pitch (missile);
		Angle = player->mo->AngleTo(missile);
		cmd->ucmd.sidemove = sleft ? -SIDERUN : SIDERUN;
		cmd->ucmd.forwardmove = -FORWARDRUN; //Back IS best.

		if ((player->mo->Pos() - old).LengthSquared() < THINKDISTSQ
			&& t_strafe<=0)
		{
			t_strafe = 5;
			sleft = !sleft;
		}

		//If able to see enemy while avoiding missile, still fire at enemy.
		if (enemy && Check_LOS (enemy, SHOOTFOV)) 
			Dofire (cmd); //Order bot to fire current weapon
	}
	else if (enemy && P_CheckSight (player->mo, enemy, 0)) //Fight!
	{
		Pitch (enemy);

		//Check if it's more important to get an item than fight.
		if (dest && (dest->flags&MF_SPECIAL)) //Must be an item, that is close enough.
		{
#define is(x) dest->IsKindOf (PClass::FindClass (#x))
			if (
				(
				 (player->mo->health < skill.isp &&
				  (is (Medikit) ||
				   is (Stimpack) ||
				   is (Soulsphere) ||
				   is (Megasphere) ||
				   is (CrystalVial)
				  )
				 ) || (
				  is (Invulnerability) ||
				  is (Invisibility) ||
				  is (Megasphere)
				 ) || 
				 dist < (GETINCOMBAT/4) ||
				 (player->ReadyWeapon == NULL || player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON)
				)
				&& (dist < GETINCOMBAT || (player->ReadyWeapon == NULL || player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
				&& Reachable (dest))
#undef is
			{
				goto roam; //Pick it up, no matter the situation. All bonuses are nice close up.
			}
		}

		dest = NULL; //To let bot turn right

		if (player->ReadyWeapon != NULL && !(player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
			player->mo->flags &= ~MF_DROPOFF; //Don't jump off any ledges when fighting.

		if (!(enemy->flags3 & MF3_ISMONSTER))
			t_fight = AFTERTICS;

		if (t_strafe <= 0 &&
			((player->mo->Pos() - old).LengthSquared() < THINKDISTSQ
			|| ((pr_botmove()%30)==10))
			)
		{
			stuck = true;
			t_strafe = 5;
			sleft = !sleft;
		}

		Angle = player->mo->AngleTo(enemy);

		if (player->ReadyWeapon == NULL ||
			player->mo->Distance2D(enemy) >
			player->ReadyWeapon->MoveCombatDist)
		{
			// If a monster, use lower speed (just for cooler apperance while strafing down doomed monster)
			cmd->ucmd.forwardmove = (enemy->flags3 & MF3_ISMONSTER) ? FORWARDWALK : FORWARDRUN;
		}
		else if (!stuck) //Too close, so move away.
		{
			// If a monster, use lower speed (just for cooler apperance while strafing down doomed monster)
			cmd->ucmd.forwardmove = (enemy->flags3 & MF3_ISMONSTER) ? -FORWARDWALK : -FORWARDRUN;
		}

		//Strafing.
		if (enemy->flags3 & MF3_ISMONSTER) //It's just a monster so take it down cool.
		{
			cmd->ucmd.sidemove = sleft ? -SIDEWALK : SIDEWALK;
		}
		else
		{
			cmd->ucmd.sidemove = sleft ? -SIDERUN : SIDERUN;
		}
		Dofire (cmd); //Order bot to fire current weapon
	}
	else if (mate && !enemy && (!dest || dest==mate)) //Follow mate move.
	{
		double matedist;

		Pitch (mate);

		if (!Reachable (mate))
		{
			if (mate == dest && pr_botmove.Random() < 32)
			{ // [RH] If the mate is the dest, pick a new dest sometimes
				dest = NULL;
			}
			goto roam;
		}

		Angle = player->mo->AngleTo(mate);

		matedist = player->mo->Distance2D(mate);
		if (matedist > (FRIEND_DIST*2))
			cmd->ucmd.forwardmove = FORWARDRUN;
		else if (matedist > FRIEND_DIST)
			cmd->ucmd.forwardmove = FORWARDWALK; //Walk, when starting to get close.
		else if (matedist < FRIEND_DIST-(FRIEND_DIST/3)) //Got too close, so move away.
			cmd->ucmd.forwardmove = -FORWARDWALK;
	}
	else //Roam after something.
	{
		first_shot = true;

	/////
	roam:
	/////
		if (enemy && Check_LOS (enemy, SHOOTFOV*3/2)) //If able to see enemy while avoiding missile , still fire at it.
			Dofire (cmd); //Order bot to fire current weapon

		if (dest && !(dest->flags&MF_SPECIAL) && dest->health < 0)
		{ //Roaming after something dead.
			dest = NULL;
		}

		if (dest == NULL)
		{
			if (t_fight && enemy) //Enemy/bot has jumped around corner. So what to do?
			{
				if (enemy->player)
				{
					if (((enemy->player->ReadyWeapon != NULL && enemy->player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE) ||
						(pr_botmove()%100)>skill.isp) && player->ReadyWeapon != NULL && !(player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
						dest = enemy;//Dont let enemy kill the bot by supressive fire. So charge enemy.
					else //hide while t_fight, but keep view at enemy.
						Angle = player->mo->AngleTo(enemy);
				} //Just a monster, so kill it.
				else
					dest = enemy;

				//VerifFavoritWeapon(player); //Dont know why here.., but it must be here, i know the reason, but not why at this spot, uh.
			}
			else //Choose a distant target. to get things going.
			{
				r = pr_botmove();
				if (r < 128)
				{
					TThinkerIterator<AInventory> it (MAX_STATNUM+1, bglobal.firstthing);
					AInventory *item = it.Next();

					if (item != NULL || (item = it.Next()) != NULL)
					{
						r &= 63;	// Only scan up to 64 entries at a time
						while (r)
						{
							--r;
							item = it.Next();
						}
						if (item == NULL)
						{
							item = it.Next();
						}
						bglobal.firstthing = item;
						dest = item;
					}
				}
				else if (mate && (r < 179 || P_CheckSight(player->mo, mate)))
				{
					dest = mate;
				}
				else if ((playeringame[(r&(MAXPLAYERS-1))]) && players[(r&(MAXPLAYERS-1))].mo->health > 0)
				{
					dest = players[(r&(MAXPLAYERS-1))].mo; 
				}
			}

			if (dest)
			{
				t_roam = MAXROAM;
			}
		}
		if (dest)
		{ //Bot has a target so roam after it.
			Roam (cmd);
		}

	} //End of movement main part.

	if (!t_roam && dest)
	{
		prev = dest;
		dest = NULL;
	}

	if (t_fight<(AFTERTICS/2))
		player->mo->flags |= MF_DROPOFF;

	old = player->mo->Pos();
}